

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duseltronik.hpp
# Opt level: O3

bool tao::pegtl::internal::
     duseltronik<queryparse::reindex,(tao::pegtl::apply_mode)1,(tao::pegtl::rewind_mode)1,tao::pegtl::nothing,tao::pegtl::parse_tree::internal::make_control<queryparse::store,tao::pegtl::normal>::type,(tao::pegtl::dusel_mode)1>
     ::
     match<tao::pegtl::string_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>,tao::pegtl::parse_tree::internal::state<tao::pegtl::parse_tree::node>&>
               (string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *in,state<tao::pegtl::parse_tree::node> *st)

{
  node *pnVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  bool bVar6;
  unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_> *this
  ;
  
  parse_tree::internal::state<tao::pegtl::parse_tree::node>::emplace_back(st);
  pnVar1 = (st->stack).
           super__Vector_base<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
           ._M_t.
           super__Tuple_impl<0UL,_tao::pegtl::parse_tree::node_*,_std::default_delete<tao::pegtl::parse_tree::node>_>
           .super__Head_base<0UL,_tao::pegtl::parse_tree::node_*,_false>._M_head_impl;
  (pnVar1->super_basic_node<tao::pegtl::parse_tree::node>).super_default_node_content.id_ =
       (type_info *)&queryparse::reindex::typeinfo;
  sVar2 = (in->
          super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).
          super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_current.byte;
  sVar3 = (in->
          super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).
          super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_current.line;
  sVar4 = (in->
          super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).
          super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_current.byte_in_line;
  ((iterator *)
  ((long)&(pnVar1->super_basic_node<tao::pegtl::parse_tree::node>).super_default_node_content + 8))
  ->data = (in->
           super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).
           super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .m_current.data;
  *(size_t *)
   ((long)&(pnVar1->super_basic_node<tao::pegtl::parse_tree::node>).super_default_node_content +
   0x10) = sVar2;
  *(size_t *)
   ((long)&(pnVar1->super_basic_node<tao::pegtl::parse_tree::node>).super_default_node_content +
   0x18) = sVar3;
  *(size_t *)
   ((long)&(pnVar1->super_basic_node<tao::pegtl::parse_tree::node>).super_default_node_content +
   0x20) = sVar4;
  std::__cxx11::string::_M_assign
            ((string *)
             ((long)&(pnVar1->super_basic_node<tao::pegtl::parse_tree::node>).
                     super_default_node_content + 0x48));
  pcVar5 = (in->
           super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).
           super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .m_current.data;
  sVar2 = (in->
          super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).
          super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_current.byte;
  sVar3 = (in->
          super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).
          super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_current.line;
  sVar4 = (in->
          super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).
          super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_current.byte_in_line;
  bVar6 = rule_conjunction<queryparse::reindex_token,_tao::pegtl::star<tao::pegtl::ascii::space>,_queryparse::string_like,_tao::pegtl::star<tao::pegtl::ascii::space>,_queryparse::index_with_construct>
          ::
          match<(tao::pegtl::apply_mode)1,_(tao::pegtl::rewind_mode)0,_tao::pegtl::nothing,_tao::pegtl::parse_tree::internal::make_control<queryparse::store,_tao::pegtl::normal>::type,_tao::pegtl::string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_tao::pegtl::parse_tree::internal::state<tao::pegtl::parse_tree::node>_&>
                    (in,st);
  if (bVar6) {
    parse_tree::internal::make_control<queryparse::store,tao::pegtl::normal>::
    control<queryparse::reindex,true>::
    success<tao::pegtl::string_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>,tao::pegtl::parse_tree::node>
              (in,st);
  }
  else {
    (in->
    super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_current.line = sVar3;
    (in->
    super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_current.byte_in_line = sVar4;
    (in->
    super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_current.data = pcVar5;
    (in->
    super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .m_current.byte = sVar2;
    this = (st->stack).
           super__Vector_base<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
    (st->stack).
    super__Vector_base<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = this;
    std::
    unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>::
    ~unique_ptr(this);
  }
  return bVar6;
}

Assistant:

static bool match( Input& in, States&&... st )
            {
               Control< Rule >::start( static_cast< const Input& >( in ), st... );

               if( duseltronik< Rule, A, M, Action, Control, dusel_mode::NOTHING >::match( in, st... ) ) {
                  Control< Rule >::success( static_cast< const Input& >( in ), st... );
                  return true;
               }
               Control< Rule >::failure( static_cast< const Input& >( in ), st... );
               return false;
            }